

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts2-lace.c
# Opt level: O2

void lace_parseParams(int *argc_p,char **argv)

{
  int iVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  
  iVar1 = *argc_p;
  for (iVar8 = 1; iVar4 = iVar1, iVar8 != iVar1; iVar8 = iVar8 + 2) {
    pbVar2 = (byte *)argv[iVar8];
    uVar3 = *pbVar2 - 0x2d;
    if (*pbVar2 == 0x2d) {
      uVar3 = pbVar2[1] - 0x77;
      if (uVar3 == 0) {
        uVar3 = (uint)pbVar2[2];
      }
      if (uVar3 != 0) {
        uVar3 = pbVar2[1] - 0x71;
        if (uVar3 == 0) {
          uVar3 = (uint)pbVar2[2];
        }
        goto LAB_001045fa;
      }
      piVar7 = &_lace_workers;
    }
    else {
LAB_001045fa:
      iVar4 = iVar8;
      if (uVar3 != 0) break;
      piVar7 = &_lace_dqsize;
    }
    iVar4 = iVar1;
    if (iVar8 + 1 == iVar1) break;
    iVar4 = atoi(argv[iVar8 + 1]);
    *piVar7 = iVar4;
  }
  uVar3 = iVar1 - iVar4;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    argv[uVar5 + 1] = argv[(long)iVar4 + uVar5];
  }
  *argc_p = uVar3 + 1;
  return;
}

Assistant:

void lace_parseParams(int* argc_p, char *argv[])
{
  int argc = *argc_p;

  int i=1;

  while (1) {
    if (i == argc) break;
    if (strcmp("-w", argv[i])==0) {
      i++;
      if (i == argc) break;
      _lace_workers = atoi(argv[i]);
    }
    else if (strcmp("-q", argv[i])==0) {
      i++;
      if (i == argc) break;
      _lace_dqsize = atoi(argv[i]);
    }
    else break;
    i++;
  }

  int j;
  for (j=1;j <= argc - i;j++) argv[j] = argv[i - 1 + j];
  *argc_p = argc - i + 1;
}